

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thanm.c
# Opt level: O3

anm_script_t * anm_script_new(void)

{
  anm_script_t *paVar1;
  
  paVar1 = (anm_script_t *)malloc(0x58);
  list_init(&paVar1->labels);
  list_init(&paVar1->instrs);
  list_init(&paVar1->raw_instrs);
  list_init(&paVar1->vars);
  paVar1->offset = (anm_offset_t *)0x0;
  paVar1->no_sentinel = 0;
  return paVar1;
}

Assistant:

anm_script_t* anm_script_new() {
    anm_script_t* script = (anm_script_t*)malloc(sizeof(anm_script_t));
    list_init(&script->labels);
    list_init(&script->instrs);
    list_init(&script->raw_instrs);
    list_init(&script->vars);
    script->offset = NULL;
    script->no_sentinel = 0;
    return script;
}